

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::anon_unknown_14::parseFlag(int argc,char **argv,char *pattern)

{
  bool bVar1;
  String SStack_38;
  
  String::String(&SStack_38);
  bVar1 = parseOption(argc,argv,pattern,(String *)0x0,&SStack_38);
  String::~String(&SStack_38);
  return bVar1;
}

Assistant:

bool parseFlag(int argc, const char* const* argv, const char* pattern) {
        return parseOption(argc, argv, pattern);
    }